

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall World::drow(World *this)

{
  bool bVar1;
  ostream *poVar2;
  reference ppVar3;
  stat *__buf;
  int local_78;
  int i_1;
  Crearue local_68 [2];
  Point PStack_48;
  pair<const_Point,_Crearue> c;
  iterator __end1;
  iterator __begin1;
  map<Point,_Crearue,_std::less<Point>,_std::allocator<std::pair<const_Point,_Crearue>_>_> *__range1
  ;
  int i;
  World *this_local;
  
  system("clear");
  std::operator<<((ostream *)&std::cout,"|");
  for (__range1._4_4_ = 0; __range1._4_4_ < (this->world_size).super_Point.y;
      __range1._4_4_ = __range1._4_4_ + 1) {
    std::operator<<((ostream *)&std::cout,"-");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"|");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar2,"|");
  __end1 = std::
           map<Point,_Crearue,_std::less<Point>,_std::allocator<std::pair<const_Point,_Crearue>_>_>
           ::begin(&this->crearues);
  register0x00000000 =
       std::map<Point,_Crearue,_std::less<Point>,_std::allocator<std::pair<const_Point,_Crearue>_>_>
       ::end(&this->crearues);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&c.second.alive);
    if (!bVar1) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_Point,_Crearue>_>::operator*(&__end1);
    c.second.point.x = *(int *)&(ppVar3->second).alive;
    PStack_48 = ppVar3->first;
    c.first = (ppVar3->second).point;
    Crearue::stat_abi_cxx11_(local_68,(char *)&c,__buf);
    std::operator<<((ostream *)&std::cout,(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
    if (c.first.y == (this->world_size).super_Point.y + -1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"|");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::operator<<(poVar2,"|");
    }
    std::_Rb_tree_iterator<std::pair<const_Point,_Crearue>_>::operator++(&__end1);
  }
  for (local_78 = 0; local_78 < (this->world_size).super_Point.y; local_78 = local_78 + 1) {
    std::operator<<((ostream *)&std::cout,"-");
  }
  std::operator<<((ostream *)&std::cout,"|");
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"Evolution: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->evol);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  this->evol = this->evol + 1;
  return;
}

Assistant:

void drow()
		{
			system("clear");
			cout << "|";
			for(int i =0; i < world_size.y; i++)
				cout << "-";
			cout << "|" << endl << "|";
			for (auto c : this->crearues)
			{
				cout << c.second.stat();
				if(c.second.point.y == this->world_size.y -1)
					cout << "|" << endl << "|";
			}
			
			for(int i =0; i < world_size.y; i++)
				cout << "-";
			cout << "|";
			cout << endl << "Evolution: " << evol << endl ;
			evol++;
		}